

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionContext_PeginSequence_Test::TestBody
          (ConfidentialTransactionContext_PeginSequence_Test *this)

{
  pointer *ppuVar1;
  ByteData *pBVar2;
  bool bVar3;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar;
  OutPoint outpoint1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Privkey key;
  ElementsAddressFactory factory;
  Transaction btc_tx;
  ConfidentialTransactionContext txc;
  UtxoData utxo1;
  ConfidentialNonce local_b70;
  Script local_b48;
  string local_b10;
  string local_af0;
  Pubkey local_ad0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_ab8;
  SigHashType local_a9c;
  Privkey local_a90;
  ElementsAddressFactory local_a70;
  Transaction local_a48;
  undefined1 local_a08 [1264];
  UtxoData local_518;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(&local_a70,kElementsRegtest);
  pBVar2 = &local_518.block_hash.data_;
  local_518.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_518,
             "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad800000000"
             ,"");
  cfd::core::Transaction::Transaction(&local_a48,(string *)&local_518);
  if ((ByteData *)local_518.block_height != pBVar2) {
    operator_delete((void *)local_518.block_height);
  }
  cfd::UtxoData::UtxoData(&local_518);
  local_518.block_height = 0;
  cfd::core::AbstractTransaction::GetTxid((Txid *)local_a08,&local_a48.super_AbstractTransaction);
  cfd::core::Txid::operator=(&local_518.txid,(Txid *)local_a08);
  local_a08._0_8_ = &PTR__Txid_00723450;
  if ((void *)CONCAT71(local_a08._9_7_,local_a08[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_a08._9_7_,local_a08[8]));
  }
  local_518.vout = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&local_518.descriptor,0,(char *)local_518.descriptor._M_string_length,0x5449f7);
  cfd::core::Amount::Amount((Amount *)local_a08,0x5f5df0c);
  local_518.amount.ignore_check_ = local_a08[8];
  local_518.amount.amount_ = local_a08._0_8_;
  ppuVar1 = (pointer *)
            ((long)&local_b48.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_b48._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b48,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_a08,(string *)&local_b48);
  cfd::core::ConfidentialAssetId::operator=(&local_518.asset,(ConfidentialAssetId *)local_a08);
  local_a08._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if ((void *)CONCAT71(local_a08._9_7_,local_a08[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_a08._9_7_,local_a08[8]));
  }
  if (local_b48._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_b48._vptr_Script);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_a08,&local_518);
  __l._M_len = 1;
  __l._M_array = (iterator)local_a08;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_ab8,__l,(allocator_type *)&local_b48);
  cfd::UtxoData::~UtxoData((UtxoData *)local_a08);
  local_b48._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b48,
             "0200000001017b9c531679cc8b8310338e350dbfd89bbfaf19fd227e3d1a69f8baf0088570120000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5db2402fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014e794713e386d83f32baa0e9d03e47c0839dc57a8c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad8000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000"
             ,"");
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_a08,(string *)&local_b48);
  if (local_b48._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_b48._vptr_Script);
  }
  cfd::core::Privkey::GenerageRandomKey();
  cfd::core::Amount::Amount((Amount *)&local_ad0,0);
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"6a","");
  cfd::core::Script::Script(&local_b48,&local_af0);
  cfd::core::Privkey::GetPubkey((Pubkey *)&local_b10,&local_a90);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_b70,(Pubkey *)&local_b10);
  cfd::core::ConfidentialTransaction::AddTxOut
            ((ConfidentialTransaction *)local_a08,(Amount *)&local_ad0,&local_518.asset,&local_b48,
             &local_b70);
  local_b70._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
  if (local_b70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b70.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b10._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_b10._M_dataplus._M_p);
  }
  cfd::core::Script::~Script(&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                ((ConfidentialTransactionContext *)local_a08,&local_ab8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_b48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3ec,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b70,(Message *)&local_b48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b70);
    if (local_b48._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_b48._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_b48._vptr_Script + 8))();
      }
    }
  }
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)local_a08,
             (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
              *)0x0,1,0,0x34,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::OutPoint::OutPoint((OutPoint *)&local_b48,&local_518.txid,local_518.vout);
  ppuVar1 = (pointer *)
            ((long)&local_b70.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_b70._vptr_ConfidentialNonce = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b70,
             "02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3","");
  cfd::core::Pubkey::Pubkey(&local_ad0,(string *)&local_b70);
  local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b10,"cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp","");
  cfd::core::Privkey::FromWif((Privkey *)&local_af0,&local_b10,kTestnet,true);
  cfd::core::SigHashType::SigHashType(&local_a9c);
  cfd::ConfidentialTransactionContext::SignWithKey
            ((ConfidentialTransactionContext *)local_a08,(OutPoint *)&local_b48,&local_ad0,
             (Privkey *)&local_af0,&local_a9c,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_af0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
    operator_delete(local_b10._M_dataplus._M_p);
  }
  if (local_ad0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ad0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b70._vptr_ConfidentialNonce != (_func_int **)ppuVar1) {
    operator_delete(local_b70._vptr_ConfidentialNonce);
  }
  cfd::ConfidentialTransactionContext::Verify
            ((ConfidentialTransactionContext *)local_a08,(OutPoint *)&local_b48);
  local_b48._vptr_Script = (_func_int **)&PTR__Txid_00723450;
  if (local_b48.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b48.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a90.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_a08);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_ab8);
  cfd::UtxoData::~UtxoData(&local_518);
  cfd::core::Transaction::~Transaction(&local_a48);
  local_a70.super_AddressFactory._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_a70.super_AddressFactory.prefix_list_);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, PeginSequence)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);

  Transaction btc_tx("020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad800000000");

  // Address1 (p2wpkh)
  // pubkey: '02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3',
  // privkey: 'cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.txid = btc_tx.GetTxid();
  utxo1.vout = 0;
  utxo1.descriptor = "wpkh(02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3)";
  utxo1.amount = Amount(int64_t{99999500});
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.locking_script = Script("0014e794713e386d83f32baa0e9d03e47c0839dc57a8");
  // utxo1.redeem_script;
  // utxo1.address = factory.GetAddress("ert1qu728z03cdkplx2a2p6ws8erupquac4ag9xjpx6");
  // utxo1.address_type = AddressType::kP2wpkhAddress;

  std::vector<cfd::UtxoData> utxos{utxo1};
  ConfidentialTransactionContext txc("0200000001017b9c531679cc8b8310338e350dbfd89bbfaf19fd227e3d1a69f8baf0088570120000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5db2402fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014e794713e386d83f32baa0e9d03e47c0839dc57a8c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad8000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000");

  auto key = Privkey::GenerageRandomKey();
  txc.AddTxOut(Amount(0), utxo1.asset, Script("6a"), ConfidentialNonce(key.GetPubkey()));

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));
  txc.Blind();

  // sign1
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  try {
    txc.SignWithKey(outpoint1,
      Pubkey("02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3"),
      Privkey::FromWif(
          "cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp", NetType::kTestnet));

    txc.Verify(outpoint1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}